

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O2

Result wabt::ParseDouble(LiteralType literal_type,char *s,char *end,uint64_t *out_bits)

{
  byte bVar1;
  ulong uVar2;
  Uint *pUVar3;
  bool bVar4;
  Result RVar5;
  ulong uVar6;
  Uint UVar7;
  char cVar8;
  byte *pbVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  char *pcVar17;
  byte *pbVar18;
  ulong uVar19;
  bool local_69;
  Uint *local_68;
  ulong local_60;
  undefined8 local_58;
  ulong local_50;
  uint32_t digit;
  ulong *local_40;
  ulong local_38;
  
  if (Nan < literal_type) {
    abort();
  }
  switch(literal_type) {
  default:
    RVar5 = anon_unknown_0::FloatParser<double>::ParseFloat(s,end,out_bits);
    return (Result)RVar5.enum_;
  case Hexfloat:
    cVar8 = *s;
    local_58 = CONCAT71((int7)((ulong)((long)&switchD_00158951::switchdataD_00170b70 +
                                      (long)(int)(&switchD_00158951::switchdataD_00170b70)
                                                 [literal_type]) >> 8),cVar8);
    bVar4 = anon_unknown_0::FloatParser<double>::StringStartsWith
                      (s + ((cVar8 - 0x2bU & 0xfd) == 0),end,"0x");
    if (!bVar4) {
      __assert_fail("StringStartsWith(s, end, \"0x\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/literal.cc"
                    ,0x107,
                    "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseHex(const char *, const char *, Uint *) [T = double]"
                   );
    }
    local_50 = 0;
    local_38 = 0x20000000000000;
    uVar19 = 0;
    iVar14 = 0;
    bVar4 = false;
    local_68 = out_bits;
    for (pbVar18 = (byte *)(s + ((cVar8 - 0x2bU & 0xfd) == 0) + 2); local_60 = uVar19, pbVar18 < end
        ; pbVar18 = pbVar18 + 1) {
      bVar1 = *pbVar18;
      iVar11 = iVar14;
      if (bVar1 == 0x2e) {
        bVar4 = true;
      }
      else if (bVar1 != 0x5f) {
        RVar5 = ParseHexdigit(bVar1,&digit);
        if (RVar5.enum_ != Ok) {
          local_69 = SUB81(local_50,0);
          if (uVar19 == 0) goto LAB_00158c18;
          if ((bVar1 | 0x20) != 0x70) {
            __assert_fail("*s == \'p\' || *s == \'P\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/literal.cc"
                          ,0x137,
                          "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseHex(const char *, const char *, Uint *) [T = double]"
                         );
          }
          bVar1 = pbVar18[1];
          pbVar9 = pbVar18 + 1;
          iVar11 = 0;
          if (bVar1 == 0x2b) {
            pbVar9 = pbVar18 + 2;
            iVar11 = iVar14;
          }
          iVar16 = 0;
          if (bVar1 == 0x2d) {
            pbVar9 = pbVar18 + 2;
            iVar16 = 0;
            iVar11 = -iVar14;
          }
          goto LAB_00158be6;
        }
        if (uVar19 < local_38) {
          uVar19 = uVar19 * 0x10 + ((ulong)_digit & 0xffffffff);
          iVar11 = iVar14 + -4;
          if (!bVar4) {
            iVar11 = iVar14;
          }
        }
        else {
          uVar6 = local_50 & 0xff;
          uVar10 = 1;
          if (digit == 0) {
            uVar10 = uVar6;
          }
          uVar2 = local_50 & 1;
          local_50 = uVar10;
          if (uVar2 != 0) {
            local_50 = uVar6;
          }
          iVar11 = iVar14 + 4;
          if (bVar4) {
            iVar11 = iVar14;
          }
        }
      }
      iVar14 = iVar11;
    }
    local_69 = SUB81(local_50,0);
    iVar11 = 0;
    if (uVar19 == 0) {
LAB_00158c18:
      *local_68 = (ulong)((char)local_58 == '-') << 0x3f;
      return (Result)Ok;
    }
    goto LAB_00158c3e;
  case Infinity:
    cVar8 = *s;
    bVar4 = anon_unknown_0::FloatParser<double>::StringStartsWith
                      (s + ((cVar8 - 0x2bU & 0xfd) == 0),end,"inf");
    if (bVar4) {
      *out_bits = ((ulong)(cVar8 != '-') << 0x3f) + 0xfff0000000000000;
      return (Result)Ok;
    }
    __assert_fail("StringStartsWith(s, end, \"inf\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/literal.cc"
                  ,0x1a4,
                  "static void wabt::(anonymous namespace)::FloatParser<double>::ParseInfinity(const char *, const char *, Uint *) [T = double]"
                 );
  case Nan:
    cVar8 = *s;
    pcVar17 = s + ((cVar8 - 0x2bU & 0xfd) == 0);
    bVar4 = anon_unknown_0::FloatParser<double>::StringStartsWith(pcVar17,end,"nan");
    if (!bVar4) {
      __assert_fail("StringStartsWith(s, end, \"nan\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/literal.cc"
                    ,0xd9,
                    "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseNan(const char *, const char *, Uint *) [T = double]"
                   );
    }
    if (pcVar17 + 3 == end) {
      uVar19 = 0x8000000000000;
    }
    else {
      local_68 = out_bits;
      bVar4 = anon_unknown_0::FloatParser<double>::StringStartsWith(pcVar17 + 3,end,":0x");
      if (!bVar4) {
        __assert_fail("StringStartsWith(s, end, \":0x\")",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/literal.cc"
                      ,0xdf,
                      "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseNan(const char *, const char *, Uint *) [T = double]"
                     );
      }
      uVar19 = 0;
      for (pcVar17 = pcVar17 + 6; pcVar17 < end; pcVar17 = pcVar17 + 1) {
        if ((*pcVar17 != '_') &&
           ((RVar5 = ParseHexdigit(*pcVar17,&digit), RVar5.enum_ == Error ||
            (uVar19 = ((ulong)_digit & 0xffffffff) + uVar19 * 0x10, 0xfffffffffffff < uVar19)))) {
          return (Result)Error;
        }
      }
      out_bits = local_68;
      if (uVar19 == 0) {
        return (Result)Error;
      }
    }
    iVar14 = 0x400;
  }
LAB_00158b84:
  UVar7 = anon_unknown_0::FloatParser<double>::Make(cVar8 == '-',iVar14,uVar19);
LAB_00158d95:
  *out_bits = UVar7;
  return (Result)Ok;
LAB_00158be6:
  if (end <= pbVar9) goto LAB_00158c35;
  if ((char)*pbVar9 != 0x5f) {
    uVar15 = (int)(char)*pbVar9 - 0x30;
    if (9 < uVar15) {
      __assert_fail("digit <= 9",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/literal.cc"
                    ,0x14c,
                    "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseHex(const char *, const char *, Uint *) [T = double]"
                   );
    }
    iVar16 = uVar15 + iVar16 * 10;
    if (0x3ff < iVar16 + iVar11) goto LAB_00158c35;
  }
  pbVar9 = pbVar9 + 1;
  goto LAB_00158be6;
LAB_00158c35:
  iVar11 = -iVar16;
  if (bVar1 != 0x2d) {
    iVar11 = iVar16;
  }
LAB_00158c3e:
  pUVar3 = local_68;
  uVar10 = 0x3f;
  if (uVar19 != 0) {
    for (; uVar19 >> uVar10 == 0; uVar10 = uVar10 - 1) {
    }
  }
  uVar10 = uVar10 ^ 0x3f;
  iVar14 = iVar14 - (int)uVar10;
  iVar16 = iVar11 + iVar14;
  uVar15 = iVar11 + iVar14 + 0x3f;
  cVar8 = (char)uVar10;
  if (-0x3ff < (int)uVar15) {
    if (uVar19 < 0x20000000000000) {
      if (uVar10 != 0xb) {
        uVar19 = uVar19 << (cVar8 - 0xbU & 0x3f);
      }
    }
    else {
      lVar13 = 1L << (10U - cVar8 & 0x3f);
      lVar12 = 0;
      if ((local_50 & 1) != 0) {
        lVar12 = lVar13;
      }
      if ((uVar19 >> ((ulong)(byte)(0xbU - cVar8) & 0x3f) & 1) != 0) {
        lVar12 = lVar13;
      }
      uVar19 = lVar12 + uVar19 >> (0xbU - cVar8 & 0x3f);
      if (0x1fffffffffffff < uVar19) {
        uVar15 = iVar16 + 0x40;
      }
    }
    if ((int)uVar15 < 0x400) {
      UVar7 = anon_unknown_0::FloatParser<double>::Make
                        ((char)local_58 == '-',uVar15,uVar19 & 0xfffffffffffff);
      *pUVar3 = UVar7;
      return (Result)Ok;
    }
    return (Result)Error;
  }
  _digit = &local_69;
  local_40 = &local_60;
  if (uVar19 >> 0x34 == 0) {
    if (uVar10 != 0xc) {
      uVar19 = uVar19 << (cVar8 - 0xcU & 0x3f);
    }
  }
  else {
    iVar14 = 0xc - (int)uVar10;
    anon_unknown_0::FloatParser<double>::ParseHex::anon_class_16_2_81164835::operator()
              ((anon_class_16_2_81164835 *)&digit,iVar14);
    uVar19 = local_60 >> ((byte)iVar14 & 0x3f);
  }
  out_bits = local_68;
  if (0xfffffbcc < uVar15) {
    local_60 = uVar19;
    if (uVar15 != 0xfffffc01) {
      uVar15 = -iVar16 - 0x43e;
      anon_unknown_0::FloatParser<double>::ParseHex::anon_class_16_2_81164835::operator()
                ((anon_class_16_2_81164835 *)&digit,uVar15);
      lVar13 = 1L << (-(char)iVar16 - 0x3fU & 0x3f);
      lVar12 = 0;
      if (local_69 != false) {
        lVar12 = lVar13;
      }
      if ((local_60 >> ((ulong)uVar15 & 0x3f) & 1) != 0) {
        lVar12 = lVar13;
      }
      local_60 = lVar12 + local_60 >> ((byte)uVar15 & 0x3f) & 0xfffffffffffff;
    }
    if (local_60 != 0) {
      iVar14 = -0x3ff;
      uVar19 = local_60;
      cVar8 = (char)local_58;
      goto LAB_00158b84;
    }
  }
  UVar7 = (ulong)((char)local_58 == '-') << 0x3f;
  goto LAB_00158d95;
}

Assistant:

Result FloatParser<T>::Parse(LiteralType literal_type,
                             const char* s,
                             const char* end,
                             Uint* out_bits) {
#if COMPILER_IS_MSVC
  if (literal_type == LiteralType::Int && StringStartsWith(s, end, "0x")) {
    // Some MSVC crt implementation of strtof doesn't support hex strings
    literal_type = LiteralType::Hexfloat;
  }
#endif
  switch (literal_type) {
    case LiteralType::Int:
    case LiteralType::Float:
      return ParseFloat(s, end, out_bits);

    case LiteralType::Hexfloat:
      return ParseHex(s, end, out_bits);

    case LiteralType::Infinity:
      ParseInfinity(s, end, out_bits);
      return Result::Ok;

    case LiteralType::Nan:
      return ParseNan(s, end, out_bits);
  }

  WABT_UNREACHABLE;
}